

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::DescribeDefaultActionTo
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,ostream *os)

{
  ostream *poVar1;
  ostream *in_RDX;
  int in_stack_00000044;
  char *in_stack_00000048;
  OnCallSpec<TestColumnSizeHandler_()> *spec;
  ArgumentTuple *in_stack_ffffffffffffffa0;
  string *psVar2;
  FunctionMockerBase<TestColumnSizeHandler_()> *in_stack_ffffffffffffffa8;
  string local_40 [32];
  OnCallSpec<TestColumnSizeHandler_()> *local_20;
  ostream *local_18;
  
  local_18 = in_RDX;
  local_20 = FindOnCallSpec(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (local_20 == (OnCallSpec<TestColumnSizeHandler_()> *)0x0) {
    std::operator<<(local_18,"returning default value.\n");
  }
  else {
    poVar1 = std::operator<<(local_18,"taking default action specified at:\n");
    UntypedOnCallSpecBase::file((UntypedOnCallSpecBase *)local_20);
    UntypedOnCallSpecBase::line((UntypedOnCallSpecBase *)local_20);
    psVar2 = local_40;
    FormatFileLocation_abi_cxx11_(in_stack_00000048,in_stack_00000044);
    poVar1 = std::operator<<(poVar1,psVar2);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == NULL) {
      *os << (internal::type_equals<Result, void>::value ?
              "returning directly.\n" :
              "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }